

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStream.h
# Opt level: O0

void __thiscall
cmBasicUVIStream<char,_std::char_traits<char>_>::cmBasicUVIStream
          (cmBasicUVIStream<char,_std::char_traits<char>_> *this,void **vtt)

{
  void **vtt_local;
  cmBasicUVIStream<char,_std::char_traits<char>_> *this_local;
  
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[-3]
            ) = vtt[3];
  std::istream::istream(this,(streambuf *)(vtt + 1));
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream +
            (long)(this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream[-3]
            ) = vtt[3];
  cmBasicUVStreambuf<char,_std::char_traits<char>_>::cmBasicUVStreambuf
            ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)
             &(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10,0x100,8);
  return;
}

Assistant:

cmBasicUVIStream<CharT, Traits>::cmBasicUVIStream()
  : std::basic_istream<CharT, Traits>(&this->Buffer)
{
}